

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalized.hpp
# Opt level: O3

void ExchCXX::
     kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinR2SCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
     eval_exc_polar(double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
                   double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double TAU_B;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  
  local_80 = lapl_a;
  local_78 = lapl_b;
  local_68 = rho_b;
  local_58 = sigma_bb;
  local_48 = sigma_aa;
  local_38 = sigma_ab;
  local_28 = rho_a;
  if (rho_a <= 1e-15) {
    local_88 = 0.0;
  }
  else {
    dVar3 = 1.0000000000000052e-40;
    if (1.0000000000000052e-40 <= sigma_aa) {
      dVar3 = sigma_aa;
    }
    dVar9 = (dVar3 + 1.0000000000000052e-40) * 0.5;
    dVar8 = 1e-15;
    if (1e-15 <= rho_a) {
      dVar8 = rho_a;
    }
    dVar7 = (double)(~-(ulong)(-dVar9 <= dVar9) & (ulong)-dVar9);
    uVar1 = -(ulong)(dVar7 <= dVar9);
    kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_polar_impl
              (dVar8,1e-15,dVar3,(double)(~uVar1 & (ulong)dVar9 | uVar1 & (ulong)dVar7),
               1.0000000000000052e-40,lapl_a,0.0,0.0,0.0,&local_88);
  }
  dVar3 = 0.0;
  if (1e-15 < local_68) {
    dVar3 = 1.0000000000000052e-40;
    if (1.0000000000000052e-40 <= local_58) {
      dVar3 = local_58;
    }
    dVar9 = (dVar3 + 1.0000000000000052e-40) * 0.5;
    dVar8 = 1e-15;
    if (1e-15 <= local_68) {
      dVar8 = local_68;
    }
    dVar7 = (double)(~-(ulong)(-dVar9 <= dVar9) & (ulong)-dVar9);
    uVar1 = -(ulong)(dVar7 <= dVar9);
    kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_polar_impl
              (dVar8,1e-15,dVar3,(double)(~uVar1 & (ulong)dVar9 | uVar1 & (ulong)dVar7),
               1.0000000000000052e-40,local_78,0.0,0.0,0.0,&local_70);
    dVar3 = local_70;
  }
  auVar2._8_8_ = local_68;
  auVar2._0_8_ = local_28;
  local_88 = local_88 * local_28;
  local_70 = dVar3 * local_68;
  if (local_28 + local_68 <= 1e-11) {
    *eps = 0.0;
  }
  else {
    auVar6._8_8_ = local_58;
    auVar6._0_8_ = local_48;
    auVar6 = maxpd(_DAT_01025230,auVar6);
    auVar2 = maxpd(_DAT_01025220,auVar2);
    auVar5._8_8_ = local_70;
    auVar5._0_8_ = local_88;
    auVar10 = maxpd(_DAT_01025200,auVar5);
    auVar4._0_8_ = auVar2._0_8_ * 8.0 * auVar10._0_8_;
    auVar4._8_8_ = auVar2._8_8_ * 8.0 * auVar10._8_8_;
    auVar5 = minpd(auVar4,auVar6);
    dVar3 = (auVar5._8_8_ + auVar5._0_8_) * 0.5;
    uVar1 = -(ulong)(-dVar3 <= local_38);
    dVar8 = (double)(uVar1 & (ulong)local_38 | ~uVar1 & (ulong)-dVar3);
    uVar1 = -(ulong)(dVar8 <= dVar3);
    kernel_traits<ExchCXX::BuiltinR2SCAN_X>::eval_exc_polar_impl
              (auVar2._0_8_,auVar2._8_8_,auVar5._0_8_,
               (double)(~uVar1 & (ulong)dVar3 | uVar1 & (ulong)dVar8),auVar5._8_8_,local_80,local_78
               ,auVar10._0_8_,auVar10._8_8_,eps);
  }
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    double TAU_A, TAU_B;
    ke_traits::eval_exc_polar(rho_a, 0.0, sigma_aa, 0.0, 0.0, lapl_a, 0.0, 0.0, 0.0, TAU_A);
    ke_traits::eval_exc_polar(rho_b, 0.0, sigma_bb, 0.0, 0.0, lapl_b, 0.0, 0.0, 0.0, TAU_B);

    TAU_A *= rho_a;
    TAU_B *= rho_b;
    xc_traits::eval_exc_polar(rho_a, rho_b, sigma_aa, sigma_ab, sigma_bb, lapl_a, lapl_b, TAU_A, TAU_B, eps);

  }